

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O3

void nuts_tran_huge_msg(char *scheme,size_t size)

{
  _Bool _Var1;
  nng_err nVar2;
  int iVar3;
  uint32_t uVar4;
  int iVar5;
  nng_url *pnVar6;
  char *pcVar7;
  size_t sVar8;
  void *pvVar9;
  size_t sVar10;
  size_t len;
  nng_url *local_68;
  nng_url *url;
  int local_54;
  size_t local_50;
  nng_dialer local_48;
  nng_listener local_44;
  nng_dialer d1;
  nng_listener l1;
  nng_msg *msg;
  nng_socket s1;
  nng_socket s2;
  
  msg._0_4_ = 0;
  msg._4_4_ = 0;
  local_44.id = 0;
  local_48.id = 0;
  pnVar6 = (nng_url *)nng_alloc(size);
  pcVar7 = strchr(scheme,0x36);
  if (pcVar7 != (char *)0x0) {
    _Var1 = nuts_has_ipv6();
    if (!_Var1) {
      acutest_skip_("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                    ,0x1cc,"No IPv6 support present");
      return;
    }
  }
  nuts_scratch_addr_zero(scheme,0x40,nuts_tran_huge_msg::nuts_addr_);
  nVar2 = nng_pair1_open((nng_socket *)&msg);
  pcVar7 = nng_strerror(nVar2);
  iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                         ,0x1ce,"%s: expected success, got %s (%d)","nng_pair1_open(&(s1))",pcVar7,
                         nVar2);
  if (iVar3 != 0) {
    nVar2 = nng_pair1_open((nng_socket *)((long)&msg + 4));
    pcVar7 = nng_strerror(nVar2);
    iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                           ,0x1cf,"%s: expected success, got %s (%d)","nng_pair1_open(&(s2))",pcVar7
                           ,nVar2);
    if (iVar3 != 0) {
      nVar2 = nng_socket_set_ms(msg._0_4_,"send-timeout",5000);
      pcVar7 = nng_strerror(nVar2);
      iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                             ,0x1d0,"%s: expected success, got %s (%d)",
                             "nng_socket_set_ms(s1, NNG_OPT_SENDTIMEO, 5000)",pcVar7,nVar2);
      if (iVar3 != 0) {
        nVar2 = nng_socket_set_ms(msg._4_4_,"send-timeout",5000);
        pcVar7 = nng_strerror(nVar2);
        iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                               ,0x1d1,"%s: expected success, got %s (%d)",
                               "nng_socket_set_ms(s2, NNG_OPT_SENDTIMEO, 5000)",pcVar7,nVar2);
        if (iVar3 != 0) {
          nVar2 = nng_socket_set_ms(msg._0_4_,"recv-timeout",5000);
          pcVar7 = nng_strerror(nVar2);
          iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                 ,0x1d2,"%s: expected success, got %s (%d)",
                                 "nng_socket_set_ms(s1, NNG_OPT_RECVTIMEO, 5000)",pcVar7,nVar2);
          if (iVar3 != 0) {
            nVar2 = nng_socket_set_ms(msg._4_4_,"recv-timeout",5000);
            pcVar7 = nng_strerror(nVar2);
            iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                   ,0x1d3,"%s: expected success, got %s (%d)",
                                   "nng_socket_set_ms(s2, NNG_OPT_RECVTIMEO, 5000)",pcVar7,nVar2);
            if (iVar3 != 0) {
              nVar2 = nng_listen(msg._0_4_,nuts_tran_huge_msg::nuts_addr_,&local_44,0);
              pcVar7 = nng_strerror(nVar2);
              iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                     ,0x1d4,"%s: expected success, got %s (%d)",
                                     "nng_listen(s1, addr, &l1, 0)",pcVar7,nVar2);
              if (iVar3 != 0) {
                nVar2 = nng_listener_get_url(local_44,&local_68);
                pcVar7 = nng_strerror(nVar2);
                iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                       ,0x1d5,"%s: expected success, got %s (%d)",
                                       "nng_listener_get_url(l1, &url)",pcVar7,nVar2);
                if (iVar3 != 0) {
                  local_50 = size;
                  nVar2 = nng_dial_url(msg._4_4_,local_68,&local_48,0);
                  pcVar7 = nng_strerror(nVar2);
                  iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                         ,0x1d6,"%s: expected success, got %s (%d)",
                                         "nng_dial_url(s2, url, &d1, 0)",pcVar7,nVar2);
                  if (iVar3 != 0) {
                    iVar3 = nng_listener_id(local_44);
                    acutest_check_((uint)(0 < iVar3),
                                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                   ,0x1d7,"%s","nng_listener_id(l1) > 0");
                    iVar3 = nng_dialer_id(local_48);
                    acutest_check_((uint)(0 < iVar3),
                                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                   ,0x1d8,"%s","nng_dialer_id(d1) > 0");
                    iVar3 = 0;
                    len = local_50;
                    url = pnVar6;
                    do {
                      local_54 = iVar3;
                      if (len != 0) {
                        sVar10 = 0;
                        do {
                          uVar4 = nng_random();
                          pnVar6->u_static[sVar10 - 0x48] = (char)uVar4;
                          sVar10 = sVar10 + 1;
                        } while (len != sVar10);
                      }
                      nVar2 = nng_send(msg._0_4_,pnVar6,len,0);
                      pcVar7 = nng_strerror(nVar2);
                      iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                             ,0x1dd,"%s: expected success, got %s (%d)",
                                             "nng_send(s1, buf, size, 0)",pcVar7,nVar2);
                      if (iVar3 == 0) goto LAB_0011cc26;
                      nVar2 = nng_recvmsg(msg._4_4_,(nng_msg **)&d1,0);
                      pcVar7 = nng_strerror(nVar2);
                      iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                             ,0x1de,"%s: expected success, got %s (%d)",
                                             "nng_recvmsg(s2, &msg, 0)",pcVar7,nVar2);
                      if (iVar3 == 0) goto LAB_0011cc26;
                      sVar8 = nng_msg_len(_d1);
                      acutest_check_((uint)(sVar8 == len),
                                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                     ,0x1df,"%s","nng_msg_len(msg) == size");
                      pvVar9 = nng_msg_body(_d1);
                      pnVar6 = url;
                      iVar3 = bcmp(pvVar9,url,len);
                      acutest_check_((uint)(iVar3 == 0),
                                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                     ,0x1e0,"%s","memcmp(nng_msg_body(msg), buf, size) == 0");
                      nng_msg_free(_d1);
                      nVar2 = nng_send(msg._4_4_,pnVar6,len,0);
                      pcVar7 = nng_strerror(nVar2);
                      iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                             ,0x1e2,"%s: expected success, got %s (%d)",
                                             "nng_send(s2, buf, size, 0)",pcVar7,nVar2);
                      if (iVar3 == 0) goto LAB_0011cc26;
                      nVar2 = nng_recvmsg(msg._0_4_,(nng_msg **)&d1,0);
                      pcVar7 = nng_strerror(nVar2);
                      iVar5 = acutest_check_((uint)(nVar2 == NNG_OK),
                                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                             ,0x1e3,"%s: expected success, got %s (%d)",
                                             "nng_recvmsg(s1, &msg, 0)",pcVar7,nVar2);
                      iVar3 = local_54;
                      if (iVar5 == 0) goto LAB_0011cc26;
                      sVar8 = nng_msg_len(_d1);
                      len = local_50;
                      acutest_check_((uint)(sVar8 == local_50),
                                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                     ,0x1e4,"%s","nng_msg_len(msg) == size");
                      pvVar9 = nng_msg_body(_d1);
                      pnVar6 = url;
                      iVar5 = bcmp(pvVar9,url,len);
                      acutest_check_((uint)(iVar5 == 0),
                                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                     ,0x1e5,"%s","memcmp(nng_msg_body(msg), buf, size) == 0");
                      nng_msg_free(_d1);
                      iVar3 = iVar3 + 1;
                    } while (iVar3 != 5);
                    nVar2 = nng_socket_close(msg._0_4_);
                    pcVar7 = nng_strerror(nVar2);
                    iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                           ,0x1e8,"%s: expected success, got %s (%d)",
                                           "nng_socket_close(s1)",pcVar7,nVar2);
                    if (iVar3 != 0) {
                      nVar2 = nng_socket_close(msg._4_4_);
                      pcVar7 = nng_strerror(nVar2);
                      iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                                             ,0x1e9,"%s: expected success, got %s (%d)",
                                             "nng_socket_close(s2)",pcVar7,nVar2);
                      if (iVar3 != 0) {
                        nng_free(pnVar6,local_50);
                        return;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_0011cc26:
  acutest_abort_();
}

Assistant:

void
nuts_tran_huge_msg(const char *scheme, size_t size)
{
	nng_socket     s1 = NNG_SOCKET_INITIALIZER;
	nng_socket     s2 = NNG_SOCKET_INITIALIZER;
	nng_listener   l1 = NNG_LISTENER_INITIALIZER;
	nng_dialer     d1 = NNG_LISTENER_INITIALIZER;
	const char    *addr;
	char          *buf;
	nng_msg       *msg;
	const nng_url *url;

	buf = nng_alloc(size);

	NUTS_SKIP_IF_IPV6_NEEDED_AND_ABSENT(scheme);
	NUTS_ADDR_ZERO(addr, scheme);
	NUTS_OPEN(s1);
	NUTS_OPEN(s2);
	NUTS_PASS(nng_socket_set_ms(s1, NNG_OPT_SENDTIMEO, 5000));
	NUTS_PASS(nng_socket_set_ms(s2, NNG_OPT_SENDTIMEO, 5000));
	NUTS_PASS(nng_socket_set_ms(s1, NNG_OPT_RECVTIMEO, 5000));
	NUTS_PASS(nng_socket_set_ms(s2, NNG_OPT_RECVTIMEO, 5000));
	NUTS_PASS(nng_listen(s1, addr, &l1, 0));
	NUTS_PASS(nng_listener_get_url(l1, &url));
	NUTS_PASS(nng_dial_url(s2, url, &d1, 0));
	NUTS_TRUE(nng_listener_id(l1) > 0);
	NUTS_TRUE(nng_dialer_id(d1) > 0);
	for (int i = 0; i < 5; i++) {
		for (size_t j = 0; j < size; j++) {
			buf[j] = nng_random() & 0xff;
		}
		NUTS_PASS(nng_send(s1, buf, size, 0));
		NUTS_PASS(nng_recvmsg(s2, &msg, 0));
		NUTS_TRUE(nng_msg_len(msg) == size);
		NUTS_TRUE(memcmp(nng_msg_body(msg), buf, size) == 0);
		nng_msg_free(msg);
		NUTS_PASS(nng_send(s2, buf, size, 0));
		NUTS_PASS(nng_recvmsg(s1, &msg, 0));
		NUTS_TRUE(nng_msg_len(msg) == size);
		NUTS_TRUE(memcmp(nng_msg_body(msg), buf, size) == 0);
		nng_msg_free(msg);
	}
	NUTS_CLOSE(s1);
	NUTS_CLOSE(s2);
	nng_free(buf, size);
}